

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

void internal_dump_attr_list(FILE *out,attr_list list,int indent)

{
  int iVar1;
  char *__ptr;
  int iVar2;
  int i;
  long lVar3;
  bool bVar4;
  size_t sStack_50;
  
  iVar1 = 0;
  iVar2 = 0;
  if (0 < indent) {
    iVar1 = indent;
    iVar2 = indent;
  }
  while (iVar1 != 0) {
    fwrite("    ",4,1,(FILE *)out);
    iVar1 = iVar1 + -1;
  }
  if (list == (attr_list)0x0) {
    __ptr = "[NULL]\n";
    sStack_50 = 7;
  }
  else {
    fwrite("[\n",2,1,(FILE *)out);
    if (list->list_of_lists == 0) {
      dump_attr_sublist(out,list,indent);
    }
    else {
      for (lVar3 = 0; lVar3 < (list->l).lists.sublist_count; lVar3 = lVar3 + 1) {
        dump_attr_sublist(out,(list->l).lists.lists[lVar3],indent);
      }
    }
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      fwrite("    ",4,1,(FILE *)out);
    }
    __ptr = "]\n";
    sStack_50 = 2;
  }
  fwrite(__ptr,sStack_50,1,(FILE *)out);
  return;
}

Assistant:

static void
internal_dump_attr_list (FILE *out, attr_list list, int indent)
{
    int i = 0;
    for (i = 0; i< indent; i++) {
        fprintf(out, "    ");
    }
    if (list == NULL) {
        fprintf(out, "[NULL]\n");
        return;
    }
    fprintf(out, "[\n");
    if (!list->list_of_lists) {
        dump_attr_sublist(out, list, indent);
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            dump_attr_sublist(out, list->l.lists.lists[i], indent);
        }
    }
    for (i=0; i< indent; i++) {
        fprintf(out, "    ");
    }
    fprintf(out, "]\n");
}